

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int32_t iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  char *__format;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 in_ZMM15 [64];
  int32_t *local_288;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  long local_230;
  long local_228;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 auVar37 [32];
  undefined1 auVar47 [32];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar15 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar15 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar15 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
LAB_007565df:
      auVar35._4_4_ = gap;
      auVar35._0_4_ = gap;
      auVar35._8_4_ = gap;
      auVar35._12_4_ = gap;
      auVar37._16_4_ = gap;
      auVar37._0_16_ = auVar35;
      auVar37._20_4_ = gap;
      auVar37._24_4_ = gap;
      auVar37._28_4_ = gap;
      auVar35 = vpinsrd_avx(auVar35,open,1);
      auVar35 = vpshufd_avx(auVar35,0x40);
      auVar35 = vpmulld_avx(auVar35,_DAT_008a5ad0);
      iVar25 = auVar35._12_4_;
      uVar50 = 0x80000000 - matrix->min;
      if (iVar25 < matrix->min) {
        uVar50 = open | 0x80000000;
      }
      iVar20 = 0x7ffffffe - matrix->max;
      auVar36 = in_ZMM1._0_16_;
      auVar53 = ZEXT1632(in_ZMM15._0_16_);
      ppVar11 = parasail_result_new_table1(_s1Len,s2Len);
      if (ppVar11 != (parasail_result_t *)0x0) {
        ppVar11->flag = ppVar11->flag | 0x8421001;
        uVar14 = (ulong)(s2Len + 0xe);
        ptr = parasail_memalign_int32_t(0x20,uVar14);
        ptr_00 = parasail_memalign_int32_t(0x20,uVar14);
        ptr_01 = parasail_memalign_int32_t(0x20,uVar14);
        if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
          lVar33 = (long)_s1Len;
          if (matrix->type == 0) {
            local_288 = parasail_memalign_int32_t(0x20,(long)(int)(_s1Len + 7));
            if (local_288 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            for (uVar14 = 0; lVar18 = lVar33, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar14;
                uVar14 = uVar14 + 1) {
              local_288[uVar14] = matrix->mapper[(byte)_s1[uVar14]];
            }
            for (; lVar18 < (int)(_s1Len + 7); lVar18 = lVar18 + 1) {
              local_288[lVar18] = 0;
            }
          }
          else {
            local_288 = (int32_t *)0x0;
          }
          auVar46 = vpinsrd_avx(ZEXT416((uint)_s1Len),s2Len,1);
          uVar12 = s2Len + 7;
          auVar36 = vpcmpeqd_avx(auVar36,auVar36);
          auVar36 = vpaddd_avx(auVar46,auVar36);
          iVar21 = uVar50 + 1;
          auVar43._4_4_ = iVar21;
          auVar43._0_4_ = iVar21;
          auVar43._8_4_ = iVar21;
          auVar43._12_4_ = iVar21;
          auVar43._16_4_ = iVar21;
          auVar43._20_4_ = iVar21;
          auVar43._24_4_ = iVar21;
          auVar43._28_4_ = iVar21;
          auVar46._4_4_ = open;
          auVar46._0_4_ = open;
          auVar46._8_4_ = open;
          auVar46._12_4_ = open;
          auVar47._16_4_ = open;
          auVar47._0_16_ = auVar46;
          auVar47._20_4_ = open;
          auVar47._24_4_ = open;
          auVar47._28_4_ = open;
          iVar9 = gap * 8;
          uVar50 = auVar36._0_4_;
          auVar38._8_4_ = 1;
          auVar38._0_8_ = 0x100000001;
          auVar38._12_4_ = 1;
          auVar38._16_4_ = 1;
          auVar38._20_4_ = 1;
          auVar38._24_4_ = 1;
          auVar38._28_4_ = 1;
          auVar8 = vpermd_avx2(auVar38,ZEXT1632(auVar36));
          iVar10 = iVar25 - gap;
          iVar23 = iVar25 + gap * -2;
          iVar16 = gap * -3 - open;
          auVar46 = vpinsrd_avx(auVar46,gap * 4,1);
          auVar46 = vpshufd_avx(auVar46,0x40);
          auVar46 = vpsubd_avx(auVar35,auVar46);
          auVar44._4_4_ = iVar16;
          auVar44._0_4_ = iVar16;
          auVar44._8_4_ = iVar16;
          auVar44._12_4_ = iVar16;
          auVar44._16_4_ = iVar16;
          auVar44._20_4_ = iVar16;
          auVar44._24_4_ = iVar16;
          auVar44._28_4_ = iVar16;
          auVar38 = vpblendd_avx2(ZEXT1632(auVar46),auVar44,0x10);
          auVar48._4_4_ = iVar23;
          auVar48._0_4_ = iVar23;
          auVar48._8_4_ = iVar23;
          auVar48._12_4_ = iVar23;
          auVar48._16_4_ = iVar23;
          auVar48._20_4_ = iVar23;
          auVar48._24_4_ = iVar23;
          auVar48._28_4_ = iVar23;
          auVar38 = vpblendd_avx2(auVar38,auVar48,0x20);
          auVar49._4_4_ = iVar10;
          auVar49._0_4_ = iVar10;
          auVar49._8_4_ = iVar10;
          auVar49._12_4_ = iVar10;
          auVar49._16_4_ = iVar10;
          auVar49._20_4_ = iVar10;
          auVar49._24_4_ = iVar10;
          auVar49._28_4_ = iVar10;
          auVar38 = vpblendd_avx2(auVar38,auVar49,0x40);
          auVar39._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar46;
          auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
          local_198 = vpblendd_avx2(auVar38,auVar39,0x88);
          uVar14 = (ulong)(uint)s2Len;
          piVar4 = matrix->mapper;
          for (uVar24 = 0; uVar14 != uVar24; uVar24 = uVar24 + 1) {
            ptr[uVar24 + 7] = piVar4[(byte)_s2[uVar24]];
          }
          for (lVar18 = 0; uVar24 = uVar14, lVar18 != 7; lVar18 = lVar18 + 1) {
            ptr[lVar18] = 0;
          }
          for (; (int)uVar24 < (int)uVar12; uVar24 = uVar24 + 1) {
            ptr[uVar24 + 7] = 0;
          }
          iVar10 = iVar25;
          for (uVar24 = 0; uVar14 != uVar24; uVar24 = uVar24 + 1) {
            ptr_00[uVar24 + 7] = iVar10;
            ptr_01[uVar24 + 7] = iVar21;
            iVar10 = iVar10 - gap;
          }
          for (lVar18 = 0; uVar24 = uVar14, lVar18 != 7; lVar18 = lVar18 + 1) {
            ptr_00[lVar18] = iVar21;
            ptr_01[lVar18] = iVar21;
          }
          for (; (int)uVar24 < (int)uVar12; uVar24 = uVar24 + 1) {
            ptr_00[uVar24 + 7] = iVar21;
            ptr_01[uVar24 + 7] = iVar21;
          }
          ptr_00[6] = 0;
          auVar39 = vpalignr_avx2(ZEXT1632(auVar43._16_16_),auVar43,4);
          lVar18 = uVar14 * 4;
          local_230 = uVar14 * 0xc + -0xc;
          auVar38 = vpmovsxbd_avx2(ZEXT816(0x1020304050607));
          local_228 = 0;
          auVar44 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
          auVar53 = vpcmpeqd_avx2(auVar53,auVar53);
          uVar24 = 0;
          local_178._4_4_ = iVar20;
          local_178._0_4_ = iVar20;
          local_178._8_4_ = iVar20;
          local_178._12_4_ = iVar20;
          local_178._16_4_ = iVar20;
          local_178._20_4_ = iVar20;
          local_178._24_4_ = iVar20;
          local_178._28_4_ = iVar20;
          auVar54 = ZEXT3264(auVar43);
          local_158 = auVar43;
          while ((long)uVar24 < lVar33) {
            uVar27 = uVar24 | 3;
            uVar17 = (uint)uVar24;
            if (matrix->type == 0) {
              uVar13 = local_288[uVar24 + 1];
              uVar32 = local_288[uVar24 + 2];
              uVar28 = local_288[uVar27];
              uVar26 = local_288[uVar24 + 4];
              uVar30 = local_288[uVar24 + 5];
              uVar22 = local_288[uVar24 + 6];
              uVar29 = (ulong)(uint)local_288[uVar24];
              uVar31 = local_288[uVar24 + 7];
            }
            else {
              uVar13 = uVar50;
              if ((long)(uVar24 | 1) < lVar33) {
                uVar13 = uVar17 | 1;
              }
              uVar32 = uVar17 | 2;
              if (lVar33 <= (long)(uVar24 | 2)) {
                uVar32 = uVar50;
              }
              uVar28 = uVar17 | 3;
              if (lVar33 <= (long)uVar27) {
                uVar28 = uVar50;
              }
              uVar26 = uVar17 | 4;
              if (lVar33 <= (long)(uVar24 | 4)) {
                uVar26 = uVar50;
              }
              uVar30 = uVar17 | 5;
              if (lVar33 <= (long)(uVar24 | 5)) {
                uVar30 = uVar50;
              }
              uVar22 = uVar17 | 6;
              if (lVar33 <= (long)(uVar24 | 6)) {
                uVar22 = uVar50;
              }
              uVar29 = uVar24;
              uVar31 = uVar17 | 7;
              if (lVar33 <= (long)(uVar24 | 7)) {
                uVar31 = uVar50;
              }
            }
            local_238 = uVar24 | 1;
            local_240 = uVar24 | 2;
            local_248 = uVar24 | 4;
            local_250 = uVar24 | 7;
            local_258 = uVar24 | 5;
            local_260 = uVar24 | 6;
            piVar4 = matrix->matrix;
            iVar10 = matrix->size;
            iVar1 = ptr_00[6];
            auVar40._4_4_ = iVar1;
            auVar40._0_4_ = iVar1;
            auVar40._8_4_ = iVar1;
            auVar40._12_4_ = iVar1;
            auVar40._16_4_ = iVar1;
            auVar40._20_4_ = iVar1;
            auVar40._24_4_ = iVar1;
            auVar40._28_4_ = iVar1;
            auVar7 = vpblendd_avx2(auVar39,auVar40,0x80);
            iVar16 = iVar25 - uVar17 * gap;
            auVar41._4_4_ = iVar16;
            auVar41._0_4_ = iVar16;
            auVar41._8_4_ = iVar16;
            auVar41._12_4_ = iVar16;
            auVar41._16_4_ = iVar16;
            auVar41._20_4_ = iVar16;
            auVar41._24_4_ = iVar16;
            auVar41._28_4_ = iVar16;
            auVar48 = vpblendd_avx2(auVar39,auVar41,0x80);
            uVar24 = uVar24 + 8;
            ptr_00[6] = iVar25 - (int)uVar24 * gap;
            auVar6._4_4_ = uVar50;
            auVar6._0_4_ = uVar50;
            auVar6._8_4_ = uVar50;
            auVar6._12_4_ = uVar50;
            auVar6._16_4_ = uVar50;
            auVar6._20_4_ = uVar50;
            auVar6._24_4_ = uVar50;
            auVar6._28_4_ = uVar50;
            auVar40 = vpcmpeqd_avx2(auVar38,auVar6);
            uVar19 = 0;
            auVar41 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
            auVar6 = auVar43;
            auVar49 = auVar43;
            for (; (~((int)uVar12 >> 0x1f) & uVar12) != uVar19; uVar19 = uVar19 + 1) {
              auVar35 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar28 * iVar10) +
                                                         (long)ptr[uVar19 + 4]]),
                                    piVar4[(long)(int)(uVar32 * iVar10) + (long)ptr[uVar19 + 5]],1);
              auVar35 = vpinsrd_avx(auVar35,piVar4[(long)(int)(uVar13 * iVar10) +
                                                   (long)ptr[uVar19 + 6]],2);
              auVar35 = vpinsrd_avx(auVar35,piVar4[(long)((int)uVar29 * iVar10) +
                                                   (long)ptr[uVar19 + 7]],3);
              auVar46 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar31 * iVar10) +
                                                         (long)ptr[uVar19]]),
                                    piVar4[(long)(int)(uVar22 * iVar10) + (long)ptr[uVar19 + 1]],1);
              auVar46 = vpinsrd_avx(auVar46,piVar4[(long)(int)(uVar30 * iVar10) +
                                                   (long)ptr[uVar19 + 2]],2);
              auVar46 = vpinsrd_avx(auVar46,piVar4[(long)(int)(uVar26 * iVar10) +
                                                   (long)ptr[uVar19 + 3]],3);
              auVar52 = vpermd_avx2(auVar44,auVar48);
              iVar1 = ptr_00[uVar19 + 7];
              auVar51._4_4_ = iVar1;
              auVar51._0_4_ = iVar1;
              auVar51._8_4_ = iVar1;
              auVar51._12_4_ = iVar1;
              auVar51._16_4_ = iVar1;
              auVar51._20_4_ = iVar1;
              auVar51._24_4_ = iVar1;
              auVar51._28_4_ = iVar1;
              auVar51 = vpblendd_avx2(auVar52,auVar51,0x80);
              auVar49 = vpermd_avx2(auVar44,auVar49);
              iVar1 = ptr_01[uVar19 + 7];
              auVar52._4_4_ = iVar1;
              auVar52._0_4_ = iVar1;
              auVar52._8_4_ = iVar1;
              auVar52._12_4_ = iVar1;
              auVar52._16_4_ = iVar1;
              auVar52._20_4_ = iVar1;
              auVar52._24_4_ = iVar1;
              auVar52._28_4_ = iVar1;
              auVar52 = vpblendd_avx2(auVar49,auVar52,0x80);
              auVar49 = vpsubd_avx2(auVar51,auVar47);
              auVar52 = vpsubd_avx2(auVar52,auVar37);
              auVar49 = vpmaxsd_avx2(auVar49,auVar52);
              auVar48 = vpsubd_avx2(auVar48,auVar47);
              auVar6 = vpsubd_avx2(auVar6,auVar37);
              auVar52 = vpmaxsd_avx2(auVar48,auVar6);
              auVar45._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar46;
              auVar45._16_16_ = ZEXT116(1) * auVar35;
              auVar48 = vpaddd_avx2(auVar7,auVar45);
              auVar6 = vpmaxsd_avx2(auVar52,auVar49);
              auVar48 = vpmaxsd_avx2(auVar48,auVar6);
              auVar6 = vpcmpeqd_avx2(auVar41,auVar53);
              auVar48 = vblendvps_avx(auVar48,local_198,auVar6);
              if (7 < uVar19) {
                local_178 = vpminsd_avx2(local_178,auVar48);
                local_158 = vpmaxsd_avx2(local_158,auVar48);
              }
              piVar5 = ((ppVar11->field_4).rowcols)->score_row;
              auVar35 = auVar48._16_16_;
              if (uVar19 < uVar14) {
                uVar3 = vextractps_avx(auVar35,3);
                *(undefined4 *)((long)piVar5 + uVar19 * 4 + local_228) = uVar3;
              }
              if (uVar19 - 1 < uVar14 && (long)local_238 < lVar33) {
                uVar3 = vextractps_avx(auVar35,2);
                *(undefined4 *)((long)piVar5 + uVar19 * 4 + lVar18 * local_238 + -4) = uVar3;
              }
              if (((long)local_240 < lVar33) && ((long)(uVar19 - 2) < (long)uVar14 && 1 < uVar19)) {
                uVar3 = vextractps_avx(auVar35,1);
                *(undefined4 *)((long)piVar5 + uVar19 * 4 + lVar18 * local_240 + -8) = uVar3;
              }
              if (((long)uVar27 < lVar33) && ((long)(uVar19 - 3) < (long)uVar14 && 2 < uVar19)) {
                *(int *)((long)piVar5 + uVar19 * 4 + local_230) = auVar48._16_4_;
              }
              if (((long)local_248 < lVar33) && ((long)(uVar19 - 4) < (long)uVar14 && 3 < uVar19)) {
                *(int *)((long)piVar5 + uVar19 * 4 + lVar18 * local_248 + -0x10) = auVar48._12_4_;
              }
              if (((long)local_258 < lVar33) && ((long)(uVar19 - 5) < (long)uVar14 && 4 < uVar19)) {
                *(int *)((long)piVar5 + uVar19 * 4 + lVar18 * local_258 + -0x14) = auVar48._8_4_;
              }
              if (((long)local_260 < lVar33) && ((long)(uVar19 - 6) < (long)uVar14 && 5 < uVar19)) {
                *(int *)((long)piVar5 + uVar19 * 4 + lVar18 * local_260 + -0x18) = auVar48._4_4_;
              }
              if (6 < uVar19 && (long)local_250 < lVar33) {
                *(int32_t *)((long)piVar5 + uVar19 * 4 + lVar18 * local_250 + -0x1c) = auVar48._0_4_
                ;
              }
              auVar49 = vblendvps_avx(auVar49,auVar43,auVar6);
              auVar6 = vblendvps_avx(auVar52,auVar43,auVar6);
              ptr_00[uVar19] = auVar48._0_4_;
              ptr_01[uVar19] = auVar49._0_4_;
              auVar7 = vpcmpeqd_avx2(auVar41,auVar8);
              auVar7 = vpand_avx2(auVar7,auVar40);
              auVar7 = vblendvps_avx(auVar54._0_32_,auVar48,auVar7);
              auVar54 = ZEXT3264(auVar7);
              auVar41 = vpsubd_avx2(auVar41,auVar53);
              auVar7 = auVar51;
            }
            auVar42._8_4_ = 8;
            auVar42._0_8_ = 0x800000008;
            auVar42._12_4_ = 8;
            auVar42._16_4_ = 8;
            auVar42._20_4_ = 8;
            auVar42._24_4_ = 8;
            auVar42._28_4_ = 8;
            auVar38 = vpaddd_avx2(auVar38,auVar42);
            auVar7._4_4_ = iVar9;
            auVar7._0_4_ = iVar9;
            auVar7._8_4_ = iVar9;
            auVar7._12_4_ = iVar9;
            auVar7._16_4_ = iVar9;
            auVar7._20_4_ = iVar9;
            auVar7._24_4_ = iVar9;
            auVar7._28_4_ = iVar9;
            local_198 = vpsubd_avx2(local_198,auVar7);
            local_230 = local_230 + uVar14 * 0x20;
            local_228 = local_228 + uVar14 * 0x20;
          }
          iVar25 = 8;
          while (bVar34 = iVar25 != 0, iVar25 = iVar25 + -1, bVar34) {
            if (iVar21 < auVar54._28_4_) {
              iVar21 = auVar54._28_4_;
            }
            auVar53 = auVar54._0_32_;
            auVar37 = vperm2i128_avx2(auVar53,auVar53,0x28);
            auVar37 = vpalignr_avx2(auVar53,auVar37,0xc);
            auVar54 = ZEXT3264(auVar37);
          }
          auVar37 = vpcmpgtd_avx2(auVar43,local_178);
          auVar53._4_4_ = iVar20;
          auVar53._0_4_ = iVar20;
          auVar53._8_4_ = iVar20;
          auVar53._12_4_ = iVar20;
          auVar53._16_4_ = iVar20;
          auVar53._20_4_ = iVar20;
          auVar53._24_4_ = iVar20;
          auVar53._28_4_ = iVar20;
          auVar53 = vpcmpgtd_avx2(local_158,auVar53);
          auVar37 = vpor_avx2(auVar37,auVar53);
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar37 >> 0x7f,0) != '\0') ||
                (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0xbf,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar37[0x1f] < '\0') {
            *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
            auVar36 = ZEXT816(0) << 0x20;
            iVar21 = 0;
          }
          ppVar11->score = iVar21;
          uVar2 = vmovlps_avx(auVar36);
          ppVar11->end_query = (int)uVar2;
          ppVar11->end_ref = (int)((ulong)uVar2 >> 0x20);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_288);
            return ppVar11;
          }
          return ppVar11;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "_s1";
    }
    else {
      if (0 < _s1Len) goto LAB_007565df;
      __format = "%s: %s must be > 0\n";
      pcVar15 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_diag_avx2_256_32",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi32(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm256_extract_epi32_rpl(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 4);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}